

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::resize
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,size_t newSize,
          Constructable *value)

{
  ulong uVar1;
  Constructable *__result;
  Constructable *in_RCX;
  Constructable *__x;
  Constructable *__first;
  ulong uVar2;
  Constructable temp;
  Constructable local_30;
  
  uVar2 = this->len;
  if (newSize < uVar2) {
    std::ranges::__destroy_fn::
    operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
              ((__destroy_fn *)(this->data_ + newSize),this->data_ + uVar2,value);
  }
  else {
    if (newSize < uVar2 || (Constructable *)(newSize - uVar2) == (Constructable *)0x0) {
      return;
    }
    uVar1 = this->cap;
    if (uVar1 < newSize) {
      local_30.constructed = true;
      local_30.value = value->value;
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls + 1;
      (anonymous_namespace)::Constructable::numCopyConstructorCalls =
           (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
      if (newSize >> 0x3c == 0) {
        __x = (Constructable *)0xfffffffffffffff;
        uVar2 = uVar1 * 2;
        if (uVar1 * 2 <= newSize) {
          uVar2 = newSize;
        }
        if (0xfffffffffffffff - uVar1 < uVar1) {
          uVar2 = 0xfffffffffffffff;
        }
        __result = (Constructable *)operator_new(uVar2 * 8);
        std::
        uninitialized_move<(anonymous_namespace)::Constructable*,(anonymous_namespace)::Constructable*>
                  (this->data_,this->data_ + this->len,__result);
        __first = (Constructable *)(newSize - this->len);
        std::ranges::__uninitialized_fill_n_fn::
        operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable>
                  ((__uninitialized_fill_n_fn *)(__result + this->len),__first,
                   (iter_difference_t<(anonymous_namespace)::Constructable_*>)&local_30,__x);
        cleanup(this,(EVP_PKEY_CTX *)__first);
        this->len = newSize;
        this->cap = uVar2;
        this->data_ = __result;
        anon_unknown.dwarf_965823::Constructable::~Constructable(&local_30);
        return;
      }
      detail::throwLengthError();
    }
    std::ranges::__uninitialized_fill_n_fn::
    operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable>
              ((__uninitialized_fill_n_fn *)(this->data_ + uVar2),(Constructable *)(newSize - uVar2)
               ,(iter_difference_t<(anonymous_namespace)::Constructable_*>)value,in_RCX);
  }
  this->len = newSize;
  return;
}

Assistant:

void resize(size_t newSize, const T& value) { resizeImpl(newSize, value); }